

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

longlong unshield_fsize(Unshield *unshield,FILE *file)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (*unshield->io_callbacks->ftell)(file,unshield->io_userdata);
  (*unshield->io_callbacks->fseek)(file,0,2,unshield->io_userdata);
  lVar2 = (*unshield->io_callbacks->ftell)(file,unshield->io_userdata);
  (*unshield->io_callbacks->fseek)(file,lVar1,0,unshield->io_userdata);
  return lVar2;
}

Assistant:

long long unshield_fsize(Unshield* unshield, FILE* file)
{
  long long result;
  long long previous = unshield_ftell(unshield, file);
  unshield_fseek(unshield, file, 0L, SEEK_END);
  result = unshield_ftell(unshield, file);
  unshield_fseek(unshield, file, previous, SEEK_SET);
  return result;
}